

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O1

_Bool read_stdin(void *buffer,size_t nbytes)

{
  uint __errnum;
  uint __fd;
  int iVar1;
  ssize_t sVar2;
  uint *puVar3;
  char *pcVar4;
  ulong unaff_R13;
  ssize_t nread;
  ulong uVar5;
  
  __fd = fileno(_stdin);
  uVar5 = 0;
  do {
    sVar2 = read(__fd,(void *)((long)buffer + uVar5),nbytes - uVar5);
    if (got_exit_signal == 0) {
      if (sVar2 < 0) {
        puVar3 = (uint *)__errno_location();
        __errnum = *puVar3;
        iVar1 = 3;
        if ((__errnum != 4) && (__errnum != 0xb)) {
          logmsg("reading from file descriptor: %d,",(ulong)__fd);
          pcVar4 = strerror(__errnum);
          logmsg("unrecoverable read() failure: (%d) %s",(ulong)__errnum,pcVar4);
          iVar1 = 1;
          unaff_R13 = 0xffffffffffffffff;
        }
      }
      else if (sVar2 == 0) {
        logmsg("got 0 reading from stdin");
        iVar1 = 1;
        unaff_R13 = 0;
      }
      else {
        uVar5 = uVar5 + sVar2;
        iVar1 = 0;
      }
    }
    else {
      logmsg("signalled to die");
      iVar1 = 1;
      unaff_R13 = 0xffffffffffffffff;
    }
    if ((iVar1 != 3) && (iVar1 != 0)) goto LAB_001064da;
  } while (uVar5 < nbytes);
  unaff_R13 = uVar5;
  if (verbose == '\x01') {
    logmsg("read %zd bytes",uVar5);
  }
LAB_001064da:
  if (unaff_R13 != nbytes) {
    logmsg("exiting...");
  }
  return unaff_R13 == nbytes;
}

Assistant:

static bool read_stdin(void *buffer, size_t nbytes)
{
  ssize_t nread = fullread(fileno(stdin), buffer, nbytes);
  if(nread != (ssize_t)nbytes) {
    logmsg("exiting...");
    return FALSE;
  }
  return TRUE;
}